

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PlainObjectBase.h
# Opt level: O2

Matrix<float,_4,_1,_0,_4,_1> * __thiscall
Eigen::PlainObjectBase<Eigen::Matrix<float,4,1,0,4,1>>::
_set_noalias<Eigen::Homogeneous<Eigen::Matrix<float,3,1,0,3,1>,0>>
          (PlainObjectBase<Eigen::Matrix<float,4,1,0,4,1>> *this,
          DenseBase<Eigen::Homogeneous<Eigen::Matrix<float,_3,_1,_0,_3,_1>,_0>_> *other)

{
  ActualDstType actualDst;
  assign_op<float,_float> local_9;
  
  internal::
  Assignment<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_Eigen::Homogeneous<Eigen::Matrix<float,_3,_1,_0,_3,_1>,_0>,_Eigen::internal::assign_op<float,_float>,_Eigen::internal::Dense2Dense,_void>
  ::run((Matrix<float,_4,_1,_0,_4,_1> *)this,(SrcXprType *)other,&local_9);
  return (Matrix<float,_4,_1,_0,_4,_1> *)this;
}

Assistant:

EIGEN_DEVICE_FUNC
    EIGEN_STRONG_INLINE Derived& _set_noalias(const DenseBase<OtherDerived>& other)
    {
      // I don't think we need this resize call since the lazyAssign will anyways resize
      // and lazyAssign will be called by the assign selector.
      //_resize_to_match(other);
      // the 'false' below means to enforce lazy evaluation. We don't use lazyAssign() because
      // it wouldn't allow to copy a row-vector into a column-vector.
      internal::call_assignment_no_alias(this->derived(), other.derived(), internal::assign_op<Scalar,typename OtherDerived::Scalar>());
      return this->derived();
    }